

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O0

Locale * icu_63::Collator::getAvailableLocales(int32_t *count)

{
  UBool UVar1;
  Locale *local_20;
  Locale *result;
  int32_t *piStack_10;
  UErrorCode status;
  int32_t *count_local;
  
  result._4_4_ = 0;
  local_20 = (Locale *)0x0;
  *count = 0;
  piStack_10 = count;
  UVar1 = isAvailableLocaleListInitialized((UErrorCode *)((long)&result + 4));
  if (UVar1 != '\0') {
    local_20 = ::availableLocaleList;
    *piStack_10 = ::availableLocaleListCount;
  }
  return local_20;
}

Assistant:

const Locale* U_EXPORT2 Collator::getAvailableLocales(int32_t& count) 
{
    UErrorCode status = U_ZERO_ERROR;
    Locale *result = NULL;
    count = 0;
    if (isAvailableLocaleListInitialized(status))
    {
        result = availableLocaleList;
        count = availableLocaleListCount;
    }
    return result;
}